

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

vm_obj_id_t __thiscall CTPNSelf::gen_code_obj_predot(CTPNSelf *this,int *is_self)

{
  int iVar1;
  undefined4 *in_RSI;
  
  iVar1 = CTcCodeStream::is_self_available(G_cs);
  if (iVar1 == 0) {
    CTcTokenizer::log_error(0x2cef);
  }
  *in_RSI = 1;
  return 0;
}

Assistant:

vm_obj_id_t CTPNSelf::gen_code_obj_predot(int *is_self)
{
    /* make sure "self" is available */
    if (!G_cs->is_self_available())
        G_tok->log_error(TCERR_SELF_NOT_AVAIL);

    /* tell the caller that this is "self" */
    *is_self = TRUE;
    return VM_INVALID_OBJ;
}